

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O2

int x11_authcmp(void *av,void *bv)

{
  int iVar1;
  int iVar2;
  X11FakeAuth *b;
  X11FakeAuth *a;
  
  iVar2 = *av;
  iVar1 = -1;
  if (*bv <= iVar2) {
    if (*bv < iVar2) {
      iVar1 = 1;
    }
    else {
      if (iVar2 == 2) {
        iVar2 = memcmp(*(void **)((long)av + 0x28),*(void **)((long)bv + 0x28),8);
        return iVar2;
      }
      if (iVar2 != 1) {
        __assert_fail("a->proto == X11_XDM",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                      ,0xa3,"int x11_authcmp(void *, void *)");
      }
      iVar2 = *(int *)((long)av + 0x10);
      if ((*(int *)((long)bv + 0x10) <= iVar2) && (iVar1 = 1, iVar2 <= *(int *)((long)bv + 0x10))) {
        iVar2 = memcmp(*(void **)((long)av + 8),*(void **)((long)bv + 8),(long)iVar2);
        return iVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

int x11_authcmp(void *av, void *bv)
{
    struct X11FakeAuth *a = (struct X11FakeAuth *)av;
    struct X11FakeAuth *b = (struct X11FakeAuth *)bv;

    if (a->proto < b->proto)
        return -1;
    else if (a->proto > b->proto)
        return +1;

    if (a->proto == X11_MIT) {
        if (a->datalen < b->datalen)
            return -1;
        else if (a->datalen > b->datalen)
            return +1;

        return memcmp(a->data, b->data, a->datalen);
    } else {
        assert(a->proto == X11_XDM);

        return memcmp(a->xa1_firstblock, b->xa1_firstblock, 8);
    }
}